

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O2

REAL __thiscall TPZInterpolatedElement::MeanSolution(TPZInterpolatedElement *this,int var)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  TPZGeoEl *this_00;
  ostream *poVar4;
  char *pcVar5;
  long rows;
  REAL weight;
  undefined8 local_288;
  double dStack_280;
  REAL detjac;
  TPZVec<double> intpoint;
  TPZManVector<double,_10> sol;
  TPZFMatrix<double> jacobian;
  TPZFMatrix<double> axes;
  TPZFMatrix<double> jacinv;
  
  iVar1 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb0))();
  plVar3 = (long *)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xb8
                               ))(this);
  if (plVar3 == (long *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"REAL TPZInterpolatedElement::MeanSolution(int)")
    ;
    poVar4 = std::operator<<(poVar4," no material ");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar5 = "Meansolution no material";
  }
  else {
    iVar2 = (**(code **)(*plVar3 + 0x88))(plVar3,var);
    if (iVar2 == 1) {
      axes.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      TPZManVector<double,_10>::TPZManVector(&sol,1,(double *)&axes);
      jacobian.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      TPZFMatrix<double>::TPZFMatrix(&axes,3,3,(double *)&jacobian);
      rows = (long)iVar1;
      TPZFMatrix<double>::TPZFMatrix(&jacobian,rows,rows);
      TPZFMatrix<double>::TPZFMatrix(&jacinv,rows,rows);
      weight = 0.0;
      TPZVec<double>::TPZVec(&intpoint,rows,&weight);
      weight = 0.0;
      this_00 = TPZCompEl::Reference((TPZCompEl *)this);
      local_288 = 0.0;
      dStack_280 = 0.0;
      iVar1 = 0;
      while( true ) {
        plVar3 = (long *)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl
                                     + 0x2c8))(this);
        iVar2 = (**(code **)(*plVar3 + 0x18))(plVar3);
        if (iVar2 <= iVar1) break;
        plVar3 = (long *)(**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl
                                     + 0x2c8))(this);
        (**(code **)(*plVar3 + 0x20))(plVar3,iVar1,&intpoint,&weight);
        TPZGeoEl::Jacobian(this_00,&intpoint,&jacobian,&axes,&detjac,&jacinv);
        (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x1b0))
                  (this,&intpoint,var,&sol);
        local_288 = local_288 + *sol.super_TPZVec<double>.fStore * weight * ABS(detjac);
        dStack_280 = dStack_280 + ABS(detjac) * weight;
        iVar1 = iVar1 + 1;
      }
      local_288 = local_288 / dStack_280;
      TPZVec<double>::~TPZVec(&intpoint);
      TPZFMatrix<double>::~TPZFMatrix(&jacinv);
      TPZFMatrix<double>::~TPZFMatrix(&jacobian);
      TPZFMatrix<double>::~TPZFMatrix(&axes);
      TPZManVector<double,_10>::~TPZManVector(&sol);
      goto LAB_01074f72;
    }
    pcVar5 = "Exiting MeanSolution: is not implemented to nvars != 1.";
  }
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
LAB_01074f72:
  return (REAL)CONCAT44(local_288._4_4_,(undefined4)local_288);
}

Assistant:

REAL TPZInterpolatedElement::MeanSolution(int var) {
    int dim = Dimension(), nvars;
    TPZMaterial * material = Material();
    if (!material) {
        cout << __PRETTY_FUNCTION__ << " no material " << std::endl;
        LOGPZ_ERROR(logger, "Meansolution no material");
        return 0.;
    }

    nvars = material->NSolutionVariables(var);
    if (nvars != 1) {
        LOGPZ_ERROR(logger, "Exiting MeanSolution: is not implemented to nvars != 1.");
        return 0.;
    }
    TPZManVector<STATE> sol(nvars, 0.);

    int i;
    TPZFMatrix<REAL> axes(3, 3, 0.);
    TPZFMatrix<REAL> jacobian(dim, dim);
    TPZFMatrix<REAL> jacinv(dim, dim);
    REAL detjac;
    TPZVec<REAL> intpoint(dim, 0.);
    REAL weight = 0.;
    REAL meanvalue = 0.;
    REAL area = 0.;
    TPZGeoEl *ref = Reference();

    for (i = 0; i < GetIntegrationRule().NPoints(); i++) {
        GetIntegrationRule().Point(i, intpoint, weight);
        ref->Jacobian(intpoint, jacobian, axes, detjac, jacinv);

        /** Compute the solution value at point integration*/
        Solution(intpoint, var, sol);
        area += weight * fabs(detjac);
#ifdef STATE_COMPLEX
        meanvalue += (weight * fabs(detjac)) * sol[0].real(); //  meanvalue += (weight*fabs(detjac)*sol[j]);
#else
        meanvalue += (weight * fabs(detjac)) * sol[0];
#endif
    }
    return (meanvalue / area);
}